

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_parser.c
# Opt level: O0

gnode_t * parse_literal_expression(gravity_parser_t *parser)

{
  gravity_lexer_t *lexer_00;
  gtoken_s token_00;
  gtoken_s token_01;
  gtoken_s token_02;
  gtoken_s token_03;
  gtoken_s token_04;
  char *pcVar1;
  undefined8 in_R8;
  undefined8 in_R9;
  gnode_t *local_70;
  char *value;
  undefined1 auStack_50 [4];
  uint32_t len;
  gtoken_s token;
  gtoken_t type;
  gravity_lexer_t *lexer;
  gravity_parser_t *parser_local;
  
  lexer_00 = parser->lexer->p[parser->lexer->n - 1];
  token.value._4_4_ = gravity_lexer_next(lexer_00);
  gravity_lexer_token((gtoken_s *)auStack_50,lexer_00);
  if (token.value._4_4_ == TOK_STRING) {
    value._4_4_ = 0;
    token_00.lineno = len;
    token_00.type = (gtoken_t)auStack_50;
    token_00.colno = token.type;
    token_00.position = token.lineno;
    token_00.bytes = token.colno;
    token_00.length = token.position;
    token_00.fileid = token.bytes;
    token_00.builtin = token.length;
    token_00.value = (char *)token._24_8_;
    pcVar1 = token_string(token_00,(uint32_t *)((long)&value + 4));
    token_01.lineno = len;
    token_01.type = (gtoken_t)auStack_50;
    token_01.colno = token.type;
    token_01.position = token.lineno;
    token_01.bytes = token.colno;
    token_01.length = token.position;
    token_01.fileid = token.bytes;
    token_01.builtin = token.length;
    token_01.value = (char *)token._24_8_;
    parser_local = (gravity_parser_t *)
                   parse_analyze_literal_string(parser,token_01,pcVar1,value._4_4_);
  }
  else if ((token.value._4_4_ == TOK_KEY_TRUE) || (token.value._4_4_ == TOK_KEY_FALSE)) {
    if (parser->declarations->n == 0) {
      local_70 = (gnode_t *)0x0;
    }
    else {
      local_70 = parser->declarations->p[parser->declarations->n - 1];
    }
    token_02.lineno = len;
    token_02.type = (gtoken_t)auStack_50;
    token_02.colno = token.type;
    token_02.position = token.lineno;
    token_02.bytes = token.colno;
    token_02.length = token.position;
    token_02.fileid = token.bytes;
    token_02.builtin = token.length;
    token_02.value = (char *)token._24_8_;
    parser_local = (gravity_parser_t *)
                   gnode_literal_bool_expr_create
                             (token_02,(uint)(token.value._4_4_ == TOK_KEY_TRUE),local_70);
  }
  else if (token.value._4_4_ == TOK_NUMBER) {
    token_04.lineno = len;
    token_04.type = (gtoken_t)auStack_50;
    token_04.colno = token.type;
    token_04.position = token.lineno;
    token_04.bytes = token.colno;
    token_04.length = token.position;
    token_04.fileid = token.bytes;
    token_04.builtin = token.length;
    token_04.value = (char *)token._24_8_;
    parser_local = (gravity_parser_t *)parse_number_expression(parser,token_04);
  }
  else {
    pcVar1 = token_name(token.value._4_4_);
    token_03.lineno = len;
    token_03.type = (gtoken_t)auStack_50;
    token_03.colno = token.type;
    token_03.position = token.lineno;
    token_03.bytes = token.colno;
    token_03.length = token.position;
    token_03.fileid = token.bytes;
    token_03.builtin = token.length;
    token_03.value = (char *)token._24_8_;
    report_error(parser,GRAVITY_ERROR_SYNTAX,token_03,"Expected literal expression but found %s.",
                 pcVar1,in_R8,in_R9);
    parser_local = (gravity_parser_t *)0x0;
  }
  return (gnode_t *)parser_local;
}

Assistant:

gnode_t *parse_literal_expression (gravity_parser_t *parser) {
    DEBUG_PARSER("parse_literal_expression");
    DECLARE_LEXER;

    gtoken_t type = gravity_lexer_next(lexer);
    gtoken_s token = gravity_lexer_token(lexer);

    if (type == TOK_STRING) {
        uint32_t len = 0;
        const char *value = token_string(token, &len);
        DEBUG_PARSER("STRING: %.*s", len, value);
        // run string analyzer because string is returned as is from the lexer
        // but string can contains escaping sequences and interpolations that
        // need to be processed
        return parse_analyze_literal_string(parser, token, value, len);
    }

    if (type == TOK_KEY_TRUE || type == TOK_KEY_FALSE) {
        return gnode_literal_bool_expr_create(token, (int32_t)(type == TOK_KEY_TRUE) ? 1 : 0, LAST_DECLARATION());
    }

    if (type != TOK_NUMBER) {
        REPORT_ERROR(token, "Expected literal expression but found %s.", token_name(type));
        return NULL;
    }

    return parse_number_expression(parser, token);
}